

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::alloc
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,int new_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CScaledGlyph *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  CScaledGlyph *pCVar11;
  long lVar12;
  ulong uVar13;
  
  this->list_size = new_len;
  uVar13 = 0xffffffffffffffff;
  if (-1 < new_len) {
    uVar13 = (ulong)(uint)new_len << 6;
  }
  pCVar11 = (CScaledGlyph *)operator_new__(uVar13);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  pCVar3 = this->list;
  if (new_len < 1) {
    if (pCVar3 == (CScaledGlyph *)0x0) goto LAB_00132b0c;
  }
  else {
    lVar12 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pCVar3->m_pGlyph + lVar12);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pCVar3->m_Line + lVar12);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_TextColor).field_1 + lVar12);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pCVar3->m_SecondaryColor).field_0 + lVar12);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pCVar11->m_SecondaryColor).field_0 + lVar12);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)&(pCVar11->m_TextColor).field_1 + lVar12);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      puVar1 = (undefined8 *)((long)&pCVar11->m_Line + lVar12);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = (undefined8 *)((long)&pCVar11->m_pGlyph + lVar12);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar12 = lVar12 + 0x40;
    } while ((ulong)(uint)new_len << 6 != lVar12);
  }
  operator_delete__(pCVar3);
  new_len = this->list_size;
  if (this->num_elements < this->list_size) {
    new_len = this->num_elements;
  }
LAB_00132b0c:
  this->num_elements = new_len;
  this->list = pCVar11;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}